

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall
CVmObjDate::restore_from_file(CVmObjDate *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_4)

{
  CVmVarHeap *pCVar1;
  vm_date_ext *pvVar2;
  long lVar3;
  ulong uVar4;
  CVmFile *in_RDI;
  vm_date_ext *ext;
  
  if ((char *)in_RDI->seek_base_ != (char *)0x0) {
    pCVar1 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar1->_vptr_CVmVarHeap[6])(pCVar1,(char *)in_RDI->seek_base_);
  }
  pvVar2 = vm_date_ext::alloc_ext((CVmObjDate *)in_RDI);
  in_RDI->seek_base_ = (long)pvVar2;
  lVar3 = CVmFile::read_int4(in_RDI);
  pvVar2->dayno = (int32_t)lVar3;
  uVar4 = CVmFile::read_uint4(in_RDI);
  pvVar2->daytime = (int32_t)uVar4;
  return;
}

Assistant:

void CVmObjDate::restore_from_file(VMG_ vm_obj_id_t self,
                                   CVmFile *fp, CVmObjFixup *)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* allocate the extension structure */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* read the data */
    ext->dayno = fp->read_int4();
    ext->daytime = fp->read_uint4();
}